

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int TIFFReadRGBATileExt(TIFF *tif,uint32_t col,uint32_t row,uint32_t *raster,int stop_on_error)

{
  int iVar1;
  char *pcVar2;
  uint local_4e0;
  uint local_4dc;
  uint32_t i_row;
  uint32_t read_ysize;
  uint32_t read_xsize;
  uint32_t tile_ysize;
  uint32_t tile_xsize;
  int ok;
  TIFFRGBAImage img;
  char emsg [1024];
  int stop_on_error_local;
  uint32_t *raster_local;
  uint32_t row_local;
  uint32_t col_local;
  TIFF *tif_local;
  
  memset(&img.row_offset,0,0x400);
  iVar1 = TIFFIsTiled(tif);
  if (iVar1 == 0) {
    pcVar2 = TIFFFileName(tif);
    TIFFErrorExtR(tif,pcVar2,"Can\'t use TIFFReadRGBATile() with striped file.");
  }
  else {
    TIFFGetFieldDefaulted(tif,0x142,&read_xsize);
    TIFFGetFieldDefaulted(tif,0x143,&read_ysize);
    if ((col % read_xsize == 0) && (row % read_ysize == 0)) {
      iVar1 = TIFFRGBAImageOK(tif,(char *)&img.row_offset);
      if ((iVar1 != 0) &&
         (iVar1 = TIFFRGBAImageBegin((TIFFRGBAImage *)&tile_xsize,tif,stop_on_error,
                                     (char *)&img.row_offset), iVar1 != 0)) {
        if ((uint)img.alpha < row + read_ysize) {
          local_4dc = img.alpha - row;
        }
        else {
          local_4dc = read_ysize;
        }
        if ((uint)img.isContig < col + read_xsize) {
          i_row = img.isContig - col;
        }
        else {
          i_row = read_xsize;
        }
        img.Bitdepth16To8._0_4_ = row;
        img.Bitdepth16To8._4_4_ = col;
        tile_ysize = TIFFRGBAImageGet((TIFFRGBAImage *)&tile_xsize,raster,i_row,local_4dc);
        TIFFRGBAImageEnd((TIFFRGBAImage *)&tile_xsize);
        if ((i_row == read_xsize) && (local_4dc == read_ysize)) {
          return tile_ysize;
        }
        for (local_4e0 = 0; local_4e0 < local_4dc; local_4e0 = local_4e0 + 1) {
          memmove(raster + (ulong)((read_ysize - local_4e0) - 1) * (ulong)read_xsize,
                  raster + (ulong)((local_4dc - local_4e0) - 1) * (ulong)i_row,(ulong)i_row << 2);
          _TIFFmemset(raster + (ulong)((read_ysize - local_4e0) - 1) * (ulong)read_xsize +
                               (ulong)i_row,0,(ulong)(read_xsize - i_row) << 2);
        }
        for (local_4e0 = local_4dc; local_4e0 < read_ysize; local_4e0 = local_4e0 + 1) {
          _TIFFmemset(raster + (ulong)((read_ysize - local_4e0) - 1) * (ulong)read_xsize,0,
                      (ulong)read_xsize << 2);
        }
        return tile_ysize;
      }
      pcVar2 = TIFFFileName(tif);
      TIFFErrorExtR(tif,pcVar2,"%s",&img.row_offset);
    }
    else {
      pcVar2 = TIFFFileName(tif);
      TIFFErrorExtR(tif,pcVar2,
                    "Row/col passed to TIFFReadRGBATile() must be topleft corner of a tile.");
    }
  }
  return 0;
}

Assistant:

int TIFFReadRGBATileExt(TIFF *tif, uint32_t col, uint32_t row, uint32_t *raster,
                        int stop_on_error)
{
    char emsg[EMSG_BUF_SIZE] = "";
    TIFFRGBAImage img;
    int ok;
    uint32_t tile_xsize, tile_ysize;
    uint32_t read_xsize, read_ysize;
    uint32_t i_row;

    /*
     * Verify that our request is legal - on a tile file, and on a
     * tile boundary.
     */

    if (!TIFFIsTiled(tif))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Can't use TIFFReadRGBATile() with striped file.");
        return (0);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_TILEWIDTH, &tile_xsize);
    TIFFGetFieldDefaulted(tif, TIFFTAG_TILELENGTH, &tile_ysize);
    if ((col % tile_xsize) != 0 || (row % tile_ysize) != 0)
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Row/col passed to TIFFReadRGBATile() must be top"
                      "left corner of a tile.");
        return (0);
    }

    /*
     * Setup the RGBA reader.
     */

    if (!TIFFRGBAImageOK(tif, emsg) ||
        !TIFFRGBAImageBegin(&img, tif, stop_on_error, emsg))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif), "%s", emsg);
        return (0);
    }

    /*
     * The TIFFRGBAImageGet() function doesn't allow us to get off the
     * edge of the image, even to fill an otherwise valid tile.  So we
     * figure out how much we can read, and fix up the tile buffer to
     * a full tile configuration afterwards.
     */

    if (row + tile_ysize > img.height)
        read_ysize = img.height - row;
    else
        read_ysize = tile_ysize;

    if (col + tile_xsize > img.width)
        read_xsize = img.width - col;
    else
        read_xsize = tile_xsize;

    /*
     * Read the chunk of imagery.
     */

    img.row_offset = row;
    img.col_offset = col;

    ok = TIFFRGBAImageGet(&img, raster, read_xsize, read_ysize);

    TIFFRGBAImageEnd(&img);

    /*
     * If our read was incomplete we will need to fix up the tile by
     * shifting the data around as if a full tile of data is being returned.
     *
     * This is all the more complicated because the image is organized in
     * bottom to top format.
     */

    if (read_xsize == tile_xsize && read_ysize == tile_ysize)
        return (ok);

    for (i_row = 0; i_row < read_ysize; i_row++)
    {
        memmove(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize,
                raster + (size_t)(read_ysize - i_row - 1) * read_xsize,
                read_xsize * sizeof(uint32_t));
        _TIFFmemset(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize +
                        read_xsize,
                    0, sizeof(uint32_t) * (tile_xsize - read_xsize));
    }

    for (i_row = read_ysize; i_row < tile_ysize; i_row++)
    {
        _TIFFmemset(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize, 0,
                    sizeof(uint32_t) * tile_xsize);
    }

    return (ok);
}